

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

char * TEST_add_static_string_option(void)

{
  int iVar1;
  char *pcVar2;
  cargo_t cargo;
  char b [10];
  char *args [3];
  cargo_t local_40;
  int local_32 [2];
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  char *local_18;
  
  iVar1 = cargo_init(&local_40,0,"program");
  if (iVar1 == 0) {
    local_18 = "abc";
    local_28 = 0x12ab1a;
    uStack_24 = 0;
    uStack_20 = 0x12aac3;
    uStack_1c = 0;
    iVar1 = cargo_add_option(local_40,0,"--beta -b","Description",".s#",local_32,10);
    if (iVar1 == 0) {
      iVar1 = cargo_parse(local_40,0,1,3,(char **)&local_28);
      if (iVar1 == 0) {
        puts("Attempt to parse value: abc");
        pcVar2 = (char *)0x0;
        if (local_32[0] != 0x636261) {
          pcVar2 = "Failed to parse correct value abc";
        }
      }
      else {
        pcVar2 = "Failed to parse static char * with value \"abc\"";
      }
    }
    else {
      pcVar2 = "Failed to add valid static string option";
    }
    cargo_destroy(&local_40);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_add_static_string_option)
{
    char b[10];
    char *args[] = { "program", "--beta", "abc" };
    ret = cargo_add_option(cargo, 0, "--beta -b",
                            "Description",
                            ".s#",
                            &b, sizeof(b));
    cargo_assert(ret == 0, "Failed to add valid static string option");

    if (cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args))
    {
        msg = "Failed to parse static char * with value \"abc\"";
        goto fail;
    }
    printf("Attempt to parse value: abc\n");
    cargo_assert(!strcmp(b, "abc"), "Failed to parse correct value abc");
    _TEST_CLEANUP();
}